

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discoverer.c
# Opt level: O0

CgreenVector * discover_tests_in(char *filename,_Bool verbose)

{
  ulong uVar1;
  _Bool verbose_00;
  byte bVar2;
  FILE *pFVar3;
  byte in_SIL;
  FILE *in_RDI;
  CgreenVector *tests;
  FILE *nm_output_pipe;
  char nm_command [1000];
  FILE *library;
  char *in_stack_fffffffffffffbe8;
  char *in_stack_fffffffffffffbf0;
  char local_408 [1007];
  undefined7 in_stack_ffffffffffffffe8;
  CgreenVector *local_8;
  
  bVar2 = in_SIL & 1;
  register0x00000000 = open_file(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  if (register0x00000000 == (FILE *)0x0) {
    local_8 = (CgreenVector *)0x0;
  }
  else {
    close_file((FILE *)0x104430);
    sprintf(local_408,"%s \'%s\' 2>&1","/usr/bin/nm",in_RDI);
    pFVar3 = open_process(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    if (pFVar3 == (FILE *)0x0) {
      local_8 = (CgreenVector *)0x0;
    }
    else {
      local_8 = (CgreenVector *)create_cgreen_vector(destroy_test_item);
      pFVar3 = stack0xffffffffffffffe0;
      uVar1 = (ulong)stack0xffffffffffffffe0 >> 0x38;
      verbose_00 = SUB81(uVar1,0);
      unique0x1000012c = pFVar3;
      add_all_tests_from(in_RDI,(CgreenVector *)CONCAT17(bVar2,in_stack_ffffffffffffffe8),verbose_00
                        );
      close_process((FILE *)0x1044b2);
    }
  }
  return local_8;
}

Assistant:

CgreenVector *discover_tests_in(const char *filename, bool verbose) {
    FILE *library = open_file(filename, "r");
    if (library == NULL)
        return NULL;
    close_file(library);

    char nm_command[1000];
    sprintf(nm_command, "%s '%s' 2>&1", NM_EXECUTABLE, filename);
    FILE *nm_output_pipe = open_process(nm_command, "r");
    if (nm_output_pipe == NULL)
        return NULL;

    CgreenVector *tests = create_cgreen_vector((GenericDestructor)&destroy_test_item);
    add_all_tests_from(nm_output_pipe, tests, verbose);
    close_process(nm_output_pipe);

    return tests;
}